

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool __thiscall
BlockFilterIndex::CustomRewind(BlockFilterIndex *this,BlockRef *current_tip,BlockRef *new_tip)

{
  long lVar1;
  bool bVar2;
  CDBIterator *val;
  type func;
  uint256 *puVar3;
  string *in_RDX;
  CDBBatch *in_RSI;
  CDBIterator *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> db_it;
  CDBBatch batch;
  CDBBatch *in_stack_fffffffffffffef8;
  FlatFilePos *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  CDBBatch *in_stack_ffffffffffffff18;
  CDBBatch *this_00;
  unique_ptr<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_> *file;
  CDBWrapper *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  CDBIterator *db_it_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  byte bVar4;
  int in_stack_ffffffffffffff74;
  _Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false> in_stack_ffffffffffffff78;
  CDBWrapper *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  file = &in_RDI[0xb].m_impl_iter;
  db_it_00 = in_RDI;
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator*
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
             in_stack_ffffffffffffff08);
  CDBBatch::CDBBatch(in_stack_ffffffffffffff18,
                     (CDBWrapper *)
                     CONCAT17(in_stack_ffffffffffffff17,
                              CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
            ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
             in_stack_fffffffffffffef8);
  val = CDBWrapper::NewIterator(in_stack_ffffffffffffff38);
  this_00 = (CDBBatch *)&stack0xffffffffffffff70;
  std::unique_ptr<CDBIterator,std::default_delete<CDBIterator>>::
  unique_ptr<std::default_delete<CDBIterator>,void>
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_fffffffffffffef8
             ,(pointer)0xf7be73);
  func = std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator*
                   ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)
                    in_stack_ffffffffffffff08);
  bVar2 = CopyHeightIndexToHashIndex
                    (db_it_00,in_RSI,in_RDX,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  if (bVar2) {
    CDBBatch::Write<unsigned_char,FlatFilePos>
              (this_00,(uchar *)CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff16,
                                                        in_stack_ffffffffffffff10)),
               in_stack_ffffffffffffff08);
    std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
              ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
               in_stack_fffffffffffffef8);
    bVar2 = CDBWrapper::WriteBatch
                      (in_stack_ffffffffffffff80,(CDBBatch *)in_stack_ffffffffffffff78._M_head_impl,
                       SUB41((uint)in_stack_ffffffffffffff74 >> 0x18,0));
    if (bVar2) {
      ReadFilterHeader((BlockFilterIndex *)in_stack_ffffffffffffff78._M_head_impl,
                       in_stack_ffffffffffffff74,
                       (uint256 *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      in_stack_ffffffffffffff08 =
           (FlatFilePos *)
           inline_assertion_check<true,std::optional<uint256>>
                     ((optional<uint256> *)val,(char *)file,(int)((ulong)in_RDI >> 0x20),
                      (char *)func,(char *)this_00);
      puVar3 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_fffffffffffffef8);
      in_RDI[0x13].parent = *(CDBWrapper **)(puVar3->super_base_blob<256U>).m_data._M_elems;
      in_RDI[0x13].m_impl_iter._M_t.
      super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
      .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl =
           *(IteratorImpl **)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      in_RDI[0x14].parent = *(CDBWrapper **)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10)
      ;
      in_RDI[0x14].m_impl_iter._M_t.
      super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
      .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl =
           *(IteratorImpl **)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      bVar4 = 1;
    }
    else {
      bVar4 = 0;
    }
  }
  else {
    bVar4 = 0;
  }
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffff08
            );
  CDBBatch::~CDBBatch(in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar4 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::CustomRewind(const interfaces::BlockRef& current_tip, const interfaces::BlockRef& new_tip)
{
    CDBBatch batch(*m_db);
    std::unique_ptr<CDBIterator> db_it(m_db->NewIterator());

    // During a reorg, we need to copy all filters for blocks that are getting disconnected from the
    // height index to the hash index so we can still find them when the height index entries are
    // overwritten.
    if (!CopyHeightIndexToHashIndex(*db_it, batch, m_name, new_tip.height, current_tip.height)) {
        return false;
    }

    // The latest filter position gets written in Commit by the call to the BaseIndex::Rewind.
    // But since this creates new references to the filter, the position should get updated here
    // atomically as well in case Commit fails.
    batch.Write(DB_FILTER_POS, m_next_filter_pos);
    if (!m_db->WriteBatch(batch)) return false;

    // Update cached header
    m_last_header = *Assert(ReadFilterHeader(new_tip.height, new_tip.hash));
    return true;
}